

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int validate_pattern(ly_ctx *ctx,char *val_str,lys_type *type,lyd_node *node)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  void **ppvVar4;
  size_t sVar5;
  uint local_38;
  uint i;
  int rc;
  lyd_node *node_local;
  lys_type *type_local;
  char *val_str_local;
  ly_ctx *ctx_local;
  
  if ((ctx == (ly_ctx *)0x0) || (type->base != LY_TYPE_STRING)) {
    __assert_fail("ctx && (type->base == LY_TYPE_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x263,
                  "int validate_pattern(struct ly_ctx *, const char *, struct lys_type *, struct lyd_node *)"
                 );
  }
  type_local = (lys_type *)val_str;
  if (val_str == (char *)0x0) {
    type_local = (lys_type *)0x1eea57;
  }
  if ((type->der == (lys_tpdf *)0x0) ||
     (iVar3 = validate_pattern(ctx,(char *)type_local,&type->der->type,node), iVar3 == 0)) {
    if (((type->info).str.patterns_pcre == (void **)0x0) && ((type->info).str.pat_count != 0)) {
      ppvVar4 = (void **)malloc((ulong)((type->info).str.pat_count << 1) << 3);
      (type->info).str.patterns_pcre = ppvVar4;
      if ((type->info).str.patterns_pcre == (void **)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","validate_pattern");
        return -1;
      }
      for (local_38 = 0; local_38 < (type->info).str.pat_count; local_38 = local_38 + 1) {
        iVar3 = lyp_precompile_pattern
                          (ctx,(char *)(*(long *)(((type->info).lref.target)->padding +
                                                 (ulong)local_38 * 0x38 + -0x1c) + 1),
                           (pcre **)((type->info).str.patterns_pcre + (local_38 << 1)),
                           (pcre_extra **)((type->info).str.patterns_pcre + (local_38 * 2 + 1)));
        if (iVar3 != 0) {
          return 1;
        }
      }
    }
    for (local_38 = 0; local_38 < (type->info).str.pat_count; local_38 = local_38 + 1) {
      pvVar1 = (type->info).str.patterns_pcre[local_38 << 1];
      pvVar2 = (type->info).str.patterns_pcre[local_38 * 2 + 1];
      sVar5 = strlen((char *)type_local);
      iVar3 = pcre_exec(pvVar1,pvVar2,type_local,sVar5 & 0xffffffff,0,0,0,0);
      if (((iVar3 != 0) &&
          (**(char **)(((type->info).lref.target)->padding + (ulong)local_38 * 0x38 + -0x1c) ==
           '\x06')) ||
         ((iVar3 == 0 &&
          (**(char **)(((type->info).lref.target)->padding + (ulong)local_38 * 0x38 + -0x1c) ==
           '\x15')))) {
        ly_vlog(ctx,LYE_NOCONSTR,LY_VLOG_LYD,node,type_local,
                *(long *)(((type->info).lref.target)->padding + (ulong)local_38 * 0x38 + -0x1c) + 1)
        ;
        if (*(long *)(((type->info).lref.target)->padding + (ulong)local_38 * 0x38 + 4) != 0) {
          ly_vlog_str(ctx,LY_VLOG_PREV,
                      *(char **)(((type->info).lref.target)->padding + (ulong)local_38 * 0x38 + 4));
        }
        if (*(long *)(((type->info).lref.target)->padding + (ulong)local_38 * 0x38 + -4) != 0) {
          ly_err_last_set_apptag
                    (ctx,*(char **)(((type->info).lref.target)->padding +
                                   (ulong)local_38 * 0x38 + -4));
        }
        return 1;
      }
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int
validate_pattern(struct ly_ctx *ctx, const char *val_str, struct lys_type *type, struct lyd_node *node)
{
    int rc;
    unsigned int i;
#ifndef LY_ENABLED_CACHE
    pcre *precomp;
#endif

    assert(ctx && (type->base == LY_TYPE_STRING));

    if (!val_str) {
        val_str = "";
    }

    if (type->der && validate_pattern(ctx, val_str, &type->der->type, node)) {
        return EXIT_FAILURE;
    }

#ifdef LY_ENABLED_CACHE
    /* there is no cache, build it */
    if (!type->info.str.patterns_pcre && type->info.str.pat_count) {
        type->info.str.patterns_pcre = malloc(2 * type->info.str.pat_count * sizeof *type->info.str.patterns_pcre);
        LY_CHECK_ERR_RETURN(!type->info.str.patterns_pcre, LOGMEM(ctx), -1);

        for (i = 0; i < type->info.str.pat_count; ++i) {
            if (lyp_precompile_pattern(ctx, &type->info.str.patterns[i].expr[1],
                                       (pcre**)&type->info.str.patterns_pcre[i * 2],
                                       (pcre_extra**)&type->info.str.patterns_pcre[i * 2 + 1])) {
                return EXIT_FAILURE;
            }
        }
    }
#endif

    for (i = 0; i < type->info.str.pat_count; ++i) {
#ifdef LY_ENABLED_CACHE
        rc = pcre_exec((pcre *)type->info.str.patterns_pcre[2 * i], (pcre_extra *)type->info.str.patterns_pcre[2 * i + 1],
                       val_str, strlen(val_str), 0, 0, NULL, 0);
#else
        if (lyp_check_pattern(ctx, &type->info.str.patterns[i].expr[1], &precomp)) {
            return EXIT_FAILURE;
        }
        rc = pcre_exec(precomp, NULL, val_str, strlen(val_str), 0, 0, NULL, 0);
        free(precomp);
#endif
        if ((rc && type->info.str.patterns[i].expr[0] == 0x06) || (!rc && type->info.str.patterns[i].expr[0] == 0x15)) {
            LOGVAL(ctx, LYE_NOCONSTR, LY_VLOG_LYD, node, val_str, &type->info.str.patterns[i].expr[1]);
            if (type->info.str.patterns[i].emsg) {
                ly_vlog_str(ctx, LY_VLOG_PREV, type->info.str.patterns[i].emsg);
            }
            if (type->info.str.patterns[i].eapptag) {
                ly_err_last_set_apptag(ctx, type->info.str.patterns[i].eapptag);
            }
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}